

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

void aom_get_var_sse_sum_8x8_quad_sse2
               (uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,uint32_t *sse8x8,
               int *sum8x8,uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  __m128i vsum_00;
  __m128i vsse_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  undefined8 extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  int *in_stack_00000008;
  int i_1;
  __m128i diff;
  __m128i r;
  __m128i s;
  int i;
  __m128i vsse;
  __m128i vsum;
  uint8_t *ref;
  uint8_t *src;
  int k;
  uint *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int iVar3;
  short in_stack_fffffffffffffea8;
  short in_stack_fffffffffffffeaa;
  short in_stack_fffffffffffffeac;
  short in_stack_fffffffffffffeae;
  short in_stack_fffffffffffffeb0;
  short in_stack_fffffffffffffeb2;
  short in_stack_fffffffffffffeb4;
  short in_stack_fffffffffffffeb6;
  longlong in_stack_fffffffffffffeb8;
  int local_11c;
  long local_f0;
  long local_e8;
  int local_dc;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  
  for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
    local_f0 = in_RDX;
    local_e8 = in_RDI;
    for (local_11c = 0; local_11c < 8; local_11c = local_11c + 1) {
      load8_8to16_sse2((uint8_t *)(local_e8 + (local_dc << 3)));
      load8_8to16_sse2((uint8_t *)(local_f0 + (local_dc << 3)));
      local_38 = (short)extraout_XMM0_Qa;
      sStack_36 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      sStack_34 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      sStack_32 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      sStack_30 = (short)extraout_XMM0_Qb;
      sStack_2e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
      sStack_2c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
      sStack_2a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
      local_48 = (short)extraout_XMM0_Qa_00;
      sStack_46 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      sStack_44 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      sStack_42 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      sStack_40 = (short)extraout_XMM0_Qb_00;
      sStack_3e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      sStack_3c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      sStack_3a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      in_stack_fffffffffffffea8 = local_38 - local_48;
      in_stack_fffffffffffffeaa = sStack_36 - sStack_46;
      in_stack_fffffffffffffeac = sStack_34 - sStack_44;
      in_stack_fffffffffffffeae = sStack_32 - sStack_42;
      in_stack_fffffffffffffeb0 = sStack_30 - sStack_40;
      in_stack_fffffffffffffeb2 = sStack_2e - sStack_3e;
      in_stack_fffffffffffffeb4 = sStack_2c - sStack_3c;
      in_stack_fffffffffffffeb6 = sStack_2a - sStack_3a;
      auVar2._2_2_ = in_stack_fffffffffffffeaa;
      auVar2._0_2_ = in_stack_fffffffffffffea8;
      auVar2._4_2_ = in_stack_fffffffffffffeac;
      auVar2._6_2_ = in_stack_fffffffffffffeae;
      auVar2._10_2_ = in_stack_fffffffffffffeb2;
      auVar2._8_2_ = in_stack_fffffffffffffeb0;
      auVar2._12_2_ = in_stack_fffffffffffffeb4;
      auVar2._14_2_ = in_stack_fffffffffffffeb6;
      auVar1._2_2_ = in_stack_fffffffffffffeaa;
      auVar1._0_2_ = in_stack_fffffffffffffea8;
      auVar1._4_2_ = in_stack_fffffffffffffeac;
      auVar1._6_2_ = in_stack_fffffffffffffeae;
      auVar1._10_2_ = in_stack_fffffffffffffeb2;
      auVar1._8_2_ = in_stack_fffffffffffffeb0;
      auVar1._12_2_ = in_stack_fffffffffffffeb4;
      auVar1._14_2_ = in_stack_fffffffffffffeb6;
      pmaddwd(auVar2,auVar1);
      local_e8 = local_e8 + in_ESI;
      local_f0 = local_f0 + in_ECX;
      in_stack_fffffffffffffeb8 = extraout_XMM0_Qa_00;
    }
    vsse_00[0]._2_2_ = in_stack_fffffffffffffeb2;
    vsse_00[0]._0_2_ = in_stack_fffffffffffffeb0;
    vsse_00[0]._4_2_ = in_stack_fffffffffffffeb4;
    vsse_00[0]._6_2_ = in_stack_fffffffffffffeb6;
    vsse_00[1] = in_stack_fffffffffffffeb8;
    vsum_00[0]._4_4_ = in_stack_fffffffffffffea4;
    vsum_00[0]._0_4_ = in_stack_fffffffffffffea0;
    vsum_00[1]._0_2_ = in_stack_fffffffffffffea8;
    vsum_00[1]._2_2_ = in_stack_fffffffffffffeaa;
    vsum_00[1]._4_2_ = in_stack_fffffffffffffeac;
    vsum_00[1]._6_2_ = in_stack_fffffffffffffeae;
    variance_final_128_pel_sse2(vsse_00,vsum_00,in_stack_fffffffffffffe98,(int *)0x491a05);
  }
  *in_stack_00000008 = *in_R8 + in_R8[1] + in_R8[2] + in_R8[3] + *in_stack_00000008;
  *(int *)diff[0] = *in_R9 + in_R9[1] + in_R9[2] + in_R9[3] + *(int *)diff[0];
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    *(int *)(diff[1] + (long)iVar3 * 4) =
         in_R8[iVar3] - (int)((long)in_R9[iVar3] * (long)in_R9[iVar3] >> 6);
  }
  return;
}

Assistant:

void aom_get_var_sse_sum_8x8_quad_sse2(const uint8_t *src_ptr, int src_stride,
                                       const uint8_t *ref_ptr, int ref_stride,
                                       uint32_t *sse8x8, int *sum8x8,
                                       unsigned int *tot_sse, int *tot_sum,
                                       uint32_t *var8x8) {
  // Loop over 4 8x8 blocks. Process one 8x32 block.
  for (int k = 0; k < 4; k++) {
    const uint8_t *src = src_ptr;
    const uint8_t *ref = ref_ptr;
    __m128i vsum = _mm_setzero_si128();
    __m128i vsse = _mm_setzero_si128();
    for (int i = 0; i < 8; i++) {
      const __m128i s = load8_8to16_sse2(src + (k * 8));
      const __m128i r = load8_8to16_sse2(ref + (k * 8));
      const __m128i diff = _mm_sub_epi16(s, r);
      vsse = _mm_add_epi32(vsse, _mm_madd_epi16(diff, diff));
      vsum = _mm_add_epi16(vsum, diff);

      src += src_stride;
      ref += ref_stride;
    }
    variance_final_128_pel_sse2(vsse, vsum, &sse8x8[k], &sum8x8[k]);
  }

  // Calculate variance at 8x8 level and total sse, sum of 8x32 block.
  *tot_sse += sse8x8[0] + sse8x8[1] + sse8x8[2] + sse8x8[3];
  *tot_sum += sum8x8[0] + sum8x8[1] + sum8x8[2] + sum8x8[3];
  for (int i = 0; i < 4; i++)
    var8x8[i] = sse8x8[i] - (uint32_t)(((int64_t)sum8x8[i] * sum8x8[i]) >> 6);
}